

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O3

bool __thiscall ON_OffsetSurfaceFunction::Initialize(ON_OffsetSurfaceFunction *this)

{
  undefined1 *this_00;
  undefined1 *this_01;
  uint row_size;
  undefined4 uVar1;
  ON_OffsetSurfaceValue *pOVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  byte bVar6;
  uint uVar7;
  ON_BumpFunction *pOVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  ulong new_capacity;
  ulong uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ON_Workspace ws;
  ON_3dVector Ds;
  ON_Matrix M;
  ON_3dVector Dt;
  double local_128;
  double local_e8;
  double dStack_e0;
  ON_Workspace local_d0;
  ON_3dVector local_c0;
  double local_a8;
  double dStack_a0;
  ON_Matrix local_90;
  ON_3dVector local_48;
  
  bVar6 = 1;
  if (this->m_bValid == false) {
    row_size = (this->m_offset_value).m_count;
    new_capacity = (ulong)row_size;
    bVar6 = 0;
    if ((0 < (int)row_size) && (bVar6 = 0, this->m_srf != (ON_Surface *)0x0)) {
      ON_Workspace::ON_Workspace(&local_d0);
      uVar7 = (this->m_bumps).m_capacity;
      if (-1 < (int)uVar7) {
        (this->m_bumps).m_count = 0;
      }
      if (uVar7 < row_size) {
        ON_SimpleArray<ON_BumpFunction>::SetCapacity(&this->m_bumps,new_capacity);
      }
      this_00 = &this->field_0x8;
      this_01 = &this->field_0x18;
      lVar13 = 0;
      uVar11 = new_capacity;
      do {
        pOVar8 = ON_SimpleArray<ON_BumpFunction>::AppendNew(&this->m_bumps);
        pOVar2 = (this->m_offset_value).m_a;
        pdVar9 = (double *)((long)&pOVar2->m_s + lVar13);
        dVar18 = *pdVar9;
        dVar19 = pdVar9[1];
        dVar20 = *(double *)((long)&pOVar2->m_radius + lVar13);
        pdVar9 = ON_Interval::operator[]((ON_Interval *)this_00,0);
        dVar14 = dVar18 - *pdVar9;
        pdVar9 = ON_Interval::operator[]((ON_Interval *)this_00,1);
        dVar15 = *pdVar9 - dVar18;
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          if ((dVar15 == 0.0) && (!NAN(dVar15))) {
            dVar15 = -dVar14;
          }
        }
        else {
          dVar14 = -dVar15;
        }
        pdVar9 = ON_Interval::operator[]((ON_Interval *)this_01,0);
        dVar16 = dVar19 - *pdVar9;
        local_a8 = dVar19;
        dStack_a0 = dVar19;
        pdVar9 = ON_Interval::operator[]((ON_Interval *)this_01,1);
        dVar17 = *pdVar9 - local_a8;
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          auVar24._8_8_ = dVar17;
          auVar24._0_8_ = dVar16;
          if ((dVar17 == 0.0) && (!NAN(dVar17))) {
            auVar24._8_8_ = -dVar16;
          }
        }
        else {
          auVar24._0_8_ = -dVar17;
          auVar24._8_8_ = dVar17;
        }
        (pOVar8->m_point).x = dVar18;
        (pOVar8->m_point).y = dVar19;
        pOVar8->m_x0 = dVar18;
        pOVar8->m_y0 = dVar19;
        auVar3 = _DAT_006994d0;
        auVar21._8_8_ = dVar15;
        auVar21._0_8_ = dVar14;
        auVar21 = divpd(_DAT_006994d0,auVar21);
        *(undefined1 (*) [16])pOVar8->m_sx = auVar21;
        auVar21 = divpd(auVar3,auVar24);
        *(undefined1 (*) [16])pOVar8->m_sy = auVar21;
        pOVar8->m_type[0] = 5;
        pOVar8->m_type[1] = 5;
        pOVar8->m_a = 1.0;
        if (dVar20 <= 0.0) {
          pdVar9 = ON_Interval::operator[]((ON_Interval *)this_00,0);
          if ((dVar18 != *pdVar9) || (NAN(dVar18) || NAN(*pdVar9))) {
LAB_0055ed55:
            dVar20 = (pOVar8->m_point).x;
            pdVar9 = ON_Interval::operator[]((ON_Interval *)this_00,1);
            if ((dVar20 == *pdVar9) && (!NAN(dVar20) && !NAN(*pdVar9))) {
              dVar20 = (pOVar8->m_point).y;
              pdVar9 = ON_Interval::operator[]((ON_Interval *)this_01,0);
              if ((dVar20 == *pdVar9) && (!NAN(dVar20) && !NAN(*pdVar9))) {
                if ((this->m_bZeroSideDerivative[1] == false) &&
                   (this->m_bZeroSideDerivative[3] == false)) {
                  pOVar8->m_type[0] = 1;
                  pdVar9 = ON_Interval::operator[]((ON_Interval *)this_00,0);
                  pOVar8->m_x0 = *pdVar9;
                  dVar20 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar8->m_sx[0] = 1.0 / dVar20;
                  dVar20 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar8->m_sx[1] = 1.0 / dVar20;
                }
                if ((this->m_bZeroSideDerivative[0] != false) ||
                   (this->m_bZeroSideDerivative[2] != false)) goto LAB_0055f0ae;
                pOVar8->m_type[1] = 1;
                pdVar9 = ON_Interval::operator[]((ON_Interval *)this_01,1);
                pOVar8->m_y0 = *pdVar9;
                dVar20 = ON_Interval::Length((ON_Interval *)this_01);
                pOVar8->m_sy[0] = -1.0 / dVar20;
                dVar20 = ON_Interval::Length((ON_Interval *)this_01);
                goto LAB_0055ee64;
              }
            }
            dVar20 = (pOVar8->m_point).x;
            pdVar9 = ON_Interval::operator[]((ON_Interval *)this_00,1);
            if ((dVar20 == *pdVar9) && (!NAN(dVar20) && !NAN(*pdVar9))) {
              dVar20 = (pOVar8->m_point).y;
              pdVar9 = ON_Interval::operator[]((ON_Interval *)this_01,1);
              if ((dVar20 == *pdVar9) && (!NAN(dVar20) && !NAN(*pdVar9))) {
                if ((this->m_bZeroSideDerivative[1] == false) &&
                   (this->m_bZeroSideDerivative[3] == false)) {
                  pOVar8->m_type[0] = 1;
                  pdVar9 = ON_Interval::operator[]((ON_Interval *)this_00,0);
                  pOVar8->m_x0 = *pdVar9;
                  dVar20 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar8->m_sx[0] = 1.0 / dVar20;
                  dVar20 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar8->m_sx[1] = 1.0 / dVar20;
                }
                if ((this->m_bZeroSideDerivative[0] != false) ||
                   (this->m_bZeroSideDerivative[2] != false)) goto LAB_0055f0ae;
                pOVar8->m_type[1] = 1;
                pdVar9 = ON_Interval::operator[]((ON_Interval *)this_01,0);
                pOVar8->m_y0 = *pdVar9;
                dVar20 = ON_Interval::Length((ON_Interval *)this_01);
                pOVar8->m_sy[0] = 1.0 / dVar20;
                dVar20 = ON_Interval::Length((ON_Interval *)this_01);
                dVar18 = 1.0;
                goto LAB_0055ee6c;
              }
            }
            dVar20 = (pOVar8->m_point).x;
            pdVar9 = ON_Interval::operator[]((ON_Interval *)this_00,0);
            if ((dVar20 == *pdVar9) && (!NAN(dVar20) && !NAN(*pdVar9))) {
              dVar20 = (pOVar8->m_point).y;
              pdVar9 = ON_Interval::operator[]((ON_Interval *)this_01,1);
              if ((dVar20 == *pdVar9) && (!NAN(dVar20) && !NAN(*pdVar9))) {
                if ((this->m_bZeroSideDerivative[1] == false) &&
                   (this->m_bZeroSideDerivative[3] == false)) {
                  pdVar9 = ON_Interval::operator[]((ON_Interval *)this_00,1);
                  pOVar8->m_x0 = *pdVar9;
                  dVar20 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar8->m_sx[0] = -1.0 / dVar20;
                  dVar20 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar8->m_sx[1] = -1.0 / dVar20;
                  pOVar8->m_type[0] = 1;
                }
                if ((this->m_bZeroSideDerivative[0] == false) &&
                   (this->m_bZeroSideDerivative[2] == false)) {
                  pdVar9 = ON_Interval::operator[]((ON_Interval *)this_01,0);
                  pOVar8->m_y0 = *pdVar9;
                  dVar20 = ON_Interval::Length((ON_Interval *)this_01);
                  pOVar8->m_sy[0] = 1.0 / dVar20;
                  dVar20 = ON_Interval::Length((ON_Interval *)this_01);
                  pOVar8->m_sy[1] = 1.0 / dVar20;
                  pOVar8->m_type[1] = 1;
                }
              }
            }
          }
          else {
            dVar20 = (pOVar8->m_point).y;
            pdVar9 = ON_Interval::operator[]((ON_Interval *)this_01,0);
            if ((dVar20 != *pdVar9) || (NAN(dVar20) || NAN(*pdVar9))) goto LAB_0055ed55;
            if ((this->m_bZeroSideDerivative[1] == false) &&
               (this->m_bZeroSideDerivative[3] == false)) {
              pOVar8->m_type[0] = 1;
              pdVar9 = ON_Interval::operator[]((ON_Interval *)this_00,1);
              pOVar8->m_x0 = *pdVar9;
              dVar20 = ON_Interval::Length((ON_Interval *)this_00);
              pOVar8->m_sx[0] = -1.0 / dVar20;
              dVar20 = ON_Interval::Length((ON_Interval *)this_00);
              pOVar8->m_sx[1] = -1.0 / dVar20;
            }
            if ((this->m_bZeroSideDerivative[0] != false) ||
               (this->m_bZeroSideDerivative[2] != false)) goto LAB_0055f0ae;
            pOVar8->m_type[1] = 1;
            pdVar9 = ON_Interval::operator[]((ON_Interval *)this_01,1);
            pOVar8->m_y0 = *pdVar9;
            dVar20 = ON_Interval::Length((ON_Interval *)this_01);
            pOVar8->m_sy[0] = -1.0 / dVar20;
            dVar20 = ON_Interval::Length((ON_Interval *)this_01);
LAB_0055ee64:
            dVar18 = -1.0;
LAB_0055ee6c:
            pOVar8->m_sy[1] = dVar18 / dVar20;
          }
        }
        else {
          bVar5 = ON_Surface::Ev1Der(this->m_srf,dVar18,local_a8,(ON_3dPoint *)&local_90,&local_c0,
                                     &local_48,0,(int *)0x0);
          if (bVar5) {
            dVar18 = ON_3dVector::Length(&local_c0);
            local_128 = dVar14;
            if (dVar14 <= dVar15) {
              local_128 = dVar15;
            }
            if ((2.3283064365386963e-10 < dVar18) && (dVar20 / dVar18 < local_128)) {
              local_128 = dVar20 / dVar18;
            }
            dVar19 = ON_3dVector::Length(&local_48);
            auVar21 = _DAT_006994d0;
            local_e8 = auVar24._0_8_;
            dStack_e0 = auVar24._8_8_;
            dVar18 = local_e8;
            if (local_e8 <= dStack_e0) {
              dVar18 = dStack_e0;
            }
            if ((2.3283064365386963e-10 < dVar19) && (dVar20 / dVar19 < dVar18)) {
              dVar18 = dVar20 / dVar19;
            }
            auVar23._4_4_ = -(uint)(dVar14 <= local_128);
            auVar23._0_4_ = -(uint)(dVar14 <= local_128);
            auVar23._8_4_ = -(uint)(dVar15 <= local_128);
            auVar23._12_4_ = -(uint)(dVar15 <= local_128);
            auVar28._1_3_ = 0;
            auVar28[0] = this->m_bZeroSideDerivative[3];
            auVar28[4] = this->m_bZeroSideDerivative[3];
            auVar28._5_3_ = 0;
            auVar28[8] = this->m_bZeroSideDerivative[1];
            auVar28._9_3_ = 0;
            auVar28[0xc] = this->m_bZeroSideDerivative[1];
            auVar28._13_3_ = 0;
            auVar28 = auVar28 & auVar23;
            auVar29._0_8_ =
                 CONCAT44((auVar28._4_4_ << 0x1f) >> 0x1f,(auVar28._0_4_ << 0x1f) >> 0x1f);
            auVar29._8_4_ = (auVar28._8_4_ << 0x1f) >> 0x1f;
            auVar29._12_4_ = (auVar28._12_4_ << 0x1f) >> 0x1f;
            auVar30._0_8_ = ~auVar29._0_8_ & (ulong)local_128;
            auVar30._8_8_ = ~auVar29._8_8_ & (ulong)local_128;
            auVar3._8_8_ = (ulong)dVar15 & auVar29._8_8_;
            auVar3._0_8_ = (ulong)dVar14 & auVar29._0_8_;
            auVar24 = divpd(_DAT_006994d0,auVar30 | auVar3);
            uVar1 = *(undefined4 *)this->m_bZeroSideDerivative;
            bVar5 = this->m_bZeroSideDerivative[2];
            *(undefined1 (*) [16])pOVar8->m_sx = auVar24;
            auVar22._4_4_ = -(uint)(local_e8 <= dVar18);
            auVar22._0_4_ = -(uint)(local_e8 <= dVar18);
            auVar22._8_4_ = -(uint)(dStack_e0 <= dVar18);
            auVar22._12_4_ = -(uint)(dStack_e0 <= dVar18);
            auVar25._4_4_ = uVar1;
            auVar25._0_4_ = uVar1;
            auVar25[8] = bVar5;
            auVar25._9_3_ = 0;
            auVar25[0xc] = bVar5;
            auVar25._13_3_ = 0;
            auVar25 = auVar25 & auVar22;
            auVar26._0_8_ =
                 CONCAT44((auVar25._4_4_ << 0x1f) >> 0x1f,(auVar25._0_4_ << 0x1f) >> 0x1f);
            auVar26._8_4_ = (auVar25._8_4_ << 0x1f) >> 0x1f;
            auVar26._12_4_ = (auVar25._12_4_ << 0x1f) >> 0x1f;
            auVar27._0_8_ = ~auVar26._0_8_ & (ulong)dVar18;
            auVar27._8_8_ = ~auVar26._8_8_ & (ulong)dVar18;
            auVar4._8_8_ = (ulong)dStack_e0 & auVar26._8_8_;
            auVar4._0_8_ = (ulong)local_e8 & auVar26._0_8_;
            auVar24 = divpd(auVar21,auVar27 | auVar4);
            *(undefined1 (*) [16])pOVar8->m_sy = auVar24;
          }
        }
LAB_0055f0ae:
        lVar13 = lVar13 + 0x28;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      ON_Matrix::ON_Matrix(&local_90,row_size,row_size);
      pdVar9 = (double *)onmalloc(new_capacity << 4);
      uVar11 = 0;
      do {
        pOVar8 = (this->m_bumps).m_a;
        dVar20 = pOVar8[uVar11].m_point.x;
        dVar18 = pOVar8[uVar11].m_point.y;
        pdVar9[uVar11] = (this->m_offset_value).m_a[uVar11].m_distance;
        lVar13 = 0;
        uVar12 = 0;
        do {
          ON_BumpFunction::Evaluate
                    ((ON_BumpFunction *)((long)((this->m_bumps).m_a)->m_type + lVar13 + -0x10),
                     dVar20,dVar18,0,&local_c0.x);
          dVar19 = local_c0.x;
          pdVar10 = ON_Matrix::operator[](&local_90,(int)uVar11);
          pdVar10[uVar12] = dVar19;
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + 0x50;
        } while (new_capacity != uVar12);
        uVar11 = uVar11 + 1;
      } while (uVar11 != new_capacity);
      uVar7 = ON_Matrix::RowReduce(&local_90,2.3283064365386963e-10,pdVar9,(double *)0x0);
      if (row_size == uVar7) {
        bVar5 = ON_Matrix::BackSolve
                          (&local_90,2.3283064365386963e-10,row_size,pdVar9,pdVar9 + new_capacity);
        if (bVar5) {
          this->m_bValid = true;
        }
      }
      if (this->m_bValid == true) {
        pdVar10 = &((this->m_bumps).m_a)->m_a;
        uVar11 = 0;
        do {
          *pdVar10 = (pdVar9 + new_capacity)[uVar11];
          uVar11 = uVar11 + 1;
          pdVar10 = pdVar10 + 10;
        } while (new_capacity != uVar11);
      }
      onfree(pdVar9);
      ON_Matrix::~ON_Matrix(&local_90);
      ON_Workspace::~ON_Workspace(&local_d0);
      bVar6 = this->m_bValid;
    }
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool ON_OffsetSurfaceFunction::Initialize()
{
  const int count = m_offset_value.Count();
  if ( !m_bValid && 0 != m_srf && count > 0)
  {
    ON_Workspace ws;
    m_bumps.SetCount(0);
    m_bumps.Reserve(count);
    int i;
    double a,b,ds,dt;
    
    for (i = 0; i < count; i++ )
    {
      ON_BumpFunction& bump = m_bumps.AppendNew();
      ON_OffsetSurfaceValue offset_value = m_offset_value[i];
      double ds0 = offset_value.m_s - m_domain[0][0];
      double ds1 = m_domain[0][1] - offset_value.m_s;
      if ( 0.0 == ds0 )
        ds0 = -ds1;
      else if ( 0.0 == ds1 )
        ds1 = -ds0;
      double dt0 = offset_value.m_t - m_domain[1][0];
      double dt1 = m_domain[1][1] - offset_value.m_t;
      if ( 0.0 == dt0 )
        dt0 = -dt1;
      else if ( 0.0 == dt1 )
        dt1 = -dt0;

      // default is a large cubic bump
      bump.m_point.x = offset_value.m_s;
      bump.m_point.y = offset_value.m_t;
      bump.m_x0 = bump.m_point.x;
      bump.m_y0 = bump.m_point.y;

      bump.m_sx[0] = -1.0/ds0;
      bump.m_sx[1] =  1.0/ds1;
      bump.m_sy[0] = -1.0/dt0;
      bump.m_sy[1] =  1.0/dt1;
      bump.m_type[0] = 5;
      bump.m_type[1] = 5;
      bump.m_a = 1.0;

      if ( offset_value.m_radius > 0.0 )
      {
        // user specified cubic bump size
        ON_3dPoint Pt;
        ON_3dVector Ds, Dt;
        if ( m_srf->Ev1Der(offset_value.m_s,offset_value.m_t,Pt,Ds,Dt) )
        {
          ds = (ds0>ds1) ? ds0 : ds1;
          dt = (dt0>dt1) ? dt0 : dt1;
          a = Ds.Length();
          if ( a > ON_ZERO_TOLERANCE )
          {
            b = offset_value.m_radius/a;
            if ( b < ds )
              ds = b;
          }
          a = Dt.Length();
          if ( a > ON_ZERO_TOLERANCE )
          {
            b = offset_value.m_radius/a;
            if ( b < dt )
              dt = b;
          }
          if ( !m_bZeroSideDerivative[0] || dt < dt0 )
            dt0 = dt;
          if ( !m_bZeroSideDerivative[1] || ds < ds1 )
            ds1 = ds;
          if ( !m_bZeroSideDerivative[2] || dt < dt1 )
            dt1 = dt;
          if ( !m_bZeroSideDerivative[3] || ds < ds0 )
            ds0 = ds;
          bump.m_sx[0] = -1.0/ds0;
          bump.m_sx[1] =  1.0/ds1;
          bump.m_sy[0] = -1.0/dt0;
          bump.m_sy[1] =  1.0/dt1;
        }
      }
      else if ( bump.m_point.x == m_domain[0][0] &&  bump.m_point.y == m_domain[1][0] )
      {
        // SW corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_type[0] = 1;
          bump.m_x0 = m_domain[0][1];
          bump.m_sx[0] = -1.0/m_domain[0].Length();
          bump.m_sx[1] = -1.0/m_domain[0].Length();
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_type[1] = 1;
          bump.m_y0 = m_domain[1][1];
          bump.m_sy[0] = -1.0/m_domain[1].Length();
          bump.m_sy[1] = -1.0/m_domain[1].Length();
        }
      }
      else if ( bump.m_point.x == m_domain[0][1] &&  bump.m_point.y == m_domain[1][0] )
      {
        // SE corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_type[0] = 1;
          bump.m_x0 = m_domain[0][0];
          bump.m_sx[0] = 1.0/m_domain[0].Length();
          bump.m_sx[1] = 1.0/m_domain[0].Length();
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_type[1] = 1;
          bump.m_y0 = m_domain[1][1];
          bump.m_sy[0] = -1.0/m_domain[1].Length();
          bump.m_sy[1] = -1.0/m_domain[1].Length();
        }
      }
      else if ( bump.m_point.x == m_domain[0][1] &&  bump.m_point.y == m_domain[1][1] )
      {
        // NE corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_type[0] = 1;
          bump.m_x0 = m_domain[0][0];
          bump.m_sx[0] = 1.0/m_domain[0].Length();
          bump.m_sx[1] = 1.0/m_domain[0].Length();
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_type[1] = 1;
          bump.m_y0 = m_domain[1][0];
          bump.m_sy[0] = 1.0/m_domain[1].Length();
          bump.m_sy[1] = 1.0/m_domain[1].Length();
        }
      }
      else if ( bump.m_point.x == m_domain[0][0] &&  bump.m_point.y == m_domain[1][1] )
      {
        // NW corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_x0 = m_domain[0][1];
          bump.m_sx[0] = -1.0/m_domain[0].Length();
          bump.m_sx[1] = -1.0/m_domain[0].Length();
          bump.m_type[0] = 1;
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_y0 = m_domain[1][0];
          bump.m_sy[0] = 1.0/m_domain[1].Length();
          bump.m_sy[1] = 1.0/m_domain[1].Length();
          bump.m_type[1] = 1;
        }
      }
    }


    ON_Matrix M(count,count);
    double* B = (double*)onmalloc(2*count*sizeof(*B));
    double* X = B + count;
    int j;
    for ( i = 0; i < count; i++ ) 
    {
      ON_2dPoint p = m_bumps[i].m_point;
      B[i] = m_offset_value[i].m_distance;
      for ( j = 0; j < count; j++ )
      {
        M[i][j] = m_bumps[j].ValueAt(p.x,p.y);
      }
    }
    int rank = M.RowReduce(ON_ZERO_TOLERANCE,B);
    if ( count == rank )
    {
      if ( M.BackSolve(ON_ZERO_TOLERANCE,count,B,X) )
      {
        m_bValid = true;
      }
    }

    if ( !m_bValid )
    {
#if 0 //defined(TL2_MATRIX_INC_)
      // Have access to SVD - try it
      for ( i = 0; i < count; i++ ) 
      {
        ON_2dPoint p = m_bumps[i].m_point;
        B[i] = m_offset_value[i].m_distance;
        for ( j = 0; j < count; j++ )
        {
          M[i][j] = m_bumps[j].ValueAt(p.x,p.y);
        }
      }
      ON_Matrix U, V;
      double* diagonal = (double*)onmalloc(2*count*sizeof(*diagonal));
      double* inverted_diagonal = diagonal + count;
      if ( TL2_MatrixSVD(M,U,diagonal,V,30) )
      {
        rank = TL2_MatrixSVDInvertDiagonal(count,diagonal,inverted_diagonal);
        if ( rank > 0 )
        {
          if ( TL2_MatrixSVDSolve(U,inverted_diagonal,V,1,B,1,X) )
          {
            m_bValid = true;
          }
        }
      }
#endif
    }

    if ( m_bValid )
    {
      for ( i = 0; i < count; i++ )
      {
        m_bumps[i].m_a = X[i];
      }
    }

    onfree(B);
  }
  return m_bValid;
}